

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O3

void __thiscall soplex::SPxBasisBase<double>::restoreInitialBasis(SPxBasisBase<double> *this)

{
  int iVar1;
  SPxOut *pSVar2;
  SPxId *pSVar3;
  char cVar4;
  SPxId SVar5;
  SPxId SVar6;
  Status SVar7;
  SPxStatus SVar8;
  SPxSolverBase<double> *theLP;
  long lVar9;
  Verbosity old_verbosity;
  DataKey local_30;
  SPxRowId local_28;
  
  pSVar2 = this->spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
    local_30.info = 5;
    local_28.super_DataKey.info = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar2->m_streams[pSVar2->m_verbosity],"ICHBAS10 setup slack basis",0x1a);
    cVar4 = (char)pSVar2->m_streams[pSVar2->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar2->m_streams[pSVar2->m_verbosity] + -0x18) +
                    cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_28);
  }
  theLP = this->theLP;
  iVar1 = (theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
          thenum;
  if (theLP->theRep == COLUMN) {
    if (0 < iVar1) {
      lVar9 = 0;
      do {
        SVar7 = dualRowStatus(this,(int)lVar9);
        (this->thedesc).rowstat.data[lVar9] = SVar7;
        local_30 = (this->theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar9];
        SPxRowId::SPxRowId(&local_28,&local_30);
        SVar5.super_DataKey.idx = local_28.super_DataKey.idx;
        SVar5.super_DataKey.info = local_28.super_DataKey.info;
        pSVar3 = (this->theBaseId).data;
        pSVar3[lVar9].super_DataKey = SVar5.super_DataKey;
        pSVar3[lVar9].super_DataKey.info = -1;
        lVar9 = lVar9 + 1;
        theLP = this->theLP;
      } while (lVar9 < (theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    if (0 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum) {
      lVar9 = 0;
      do {
        SVar7 = primalColStatus<double>((int)lVar9,&theLP->super_SPxLPBase<double>);
        (this->thedesc).colstat.data[lVar9] = SVar7;
        lVar9 = lVar9 + 1;
        theLP = this->theLP;
      } while (lVar9 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
  }
  else {
    if (0 < iVar1) {
      lVar9 = 0;
      do {
        SVar7 = dualRowStatus(this,(int)lVar9);
        (this->thedesc).rowstat.data[lVar9] = SVar7;
        lVar9 = lVar9 + 1;
        theLP = this->theLP;
      } while (lVar9 < (theLP->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
    if (0 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
            thenum) {
      lVar9 = 0;
      do {
        SVar7 = primalColStatus<double>((int)lVar9,&theLP->super_SPxLPBase<double>);
        (this->thedesc).colstat.data[lVar9] = SVar7;
        local_30 = (this->theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thekey[lVar9];
        SPxColId::SPxColId((SPxColId *)&local_28,&local_30);
        SVar6.super_DataKey.idx = local_28.super_DataKey.idx;
        SVar6.super_DataKey.info = local_28.super_DataKey.info;
        pSVar3 = (this->theBaseId).data;
        pSVar3[lVar9].super_DataKey = SVar6.super_DataKey;
        pSVar3[lVar9].super_DataKey.info = 1;
        lVar9 = lVar9 + 1;
        theLP = this->theLP;
      } while (lVar9 < (theLP->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    }
  }
  SVar8 = this->thestatus;
  if (NO_PROBLEM < SVar8) {
    if (this->matrixIsSetup == true) {
      loadMatrixVecs(this);
      SVar8 = this->thestatus;
    }
    if (SVar8 == REGULAR) {
      return;
    }
  }
  this->thestatus = REGULAR;
  return;
}

Assistant:

void SPxBasisBase<R>::restoreInitialBasis()
{
   assert(!factorized);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "ICHBAS10 setup slack basis" << std::endl;)

   if(theLP->rep() == SPxSolverBase<R>::COLUMN)
   {
      for(int i = 0; i < theLP->nRows(); ++i)
      {
         thedesc.rowStatus(i) = dualRowStatus(i);
         baseId(i) = theLP->SPxLPBase<R>::rId(i);
      }

      for(int i = 0; i < theLP->nCols(); ++i)
         thedesc.colStatus(i) = primalColStatus(i, theLP);
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::ROW);

      for(int i = 0; i < theLP->nRows(); ++i)
         thedesc.rowStatus(i) = dualRowStatus(i);

      for(int i = 0; i < theLP->nCols(); ++i)
      {
         thedesc.colStatus(i) = primalColStatus(i, theLP);
         baseId(i) = theLP->SPxLPBase<R>::cId(i);
      }
   }

   /* if matrix was set up, load new basis vectors to the matrix */
   if(status() > NO_PROBLEM && matrixIsSetup)
      loadMatrixVecs();

   /* update basis status */
   setStatus(REGULAR);
}